

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O3

void dg::pta::dumpNode(PSNode *nd,string *errors)

{
  PSNode *pPVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong *puVar10;
  long *plVar11;
  uint uVar12;
  string *psVar13;
  char *pcVar14;
  ulong uVar15;
  string __str_1;
  string __str;
  allocator local_f1;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  PSNode *local_d0;
  string *local_c8;
  long *local_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 uStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  ulong local_80;
  ulong local_78;
  ulong *local_70;
  uint local_68;
  undefined4 uStack_64;
  ulong local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  uVar5 = nd->type - ALLOC;
  if (uVar5 < 0x17) {
    pcVar14 = (&PTR_anon_var_dwarf_4fcef_00115c08)[uVar5];
  }
  else {
    pcVar14 = "Unknown type";
  }
  local_d0 = nd;
  std::__cxx11::string::string((string *)local_50,pcVar14,&local_f1);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_90 = *puVar10;
    lStack_88 = plVar7[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar10;
    local_a0 = (ulong *)*plVar7;
  }
  local_98 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar5 = (local_d0->super_SubgraphNode<dg::pta::PSNode>).id;
  cVar4 = '\x01';
  if (9 < uVar5) {
    uVar12 = uVar5;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar12 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010f2bd;
      }
      if (uVar12 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010f2bd;
      }
      if (uVar12 < 10000) goto LAB_0010f2bd;
      bVar2 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010f2bd:
  local_c8 = errors;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,local_68,uVar5);
  psVar13 = local_c8;
  uVar9 = CONCAT44(uStack_64,local_68) + local_98;
  uVar15 = 0xf;
  if (local_a0 != &local_90) {
    uVar15 = local_90;
  }
  if (uVar15 < uVar9) {
    uVar15 = 0xf;
    if (local_70 != local_60) {
      uVar15 = local_60[0];
    }
    if (uVar9 <= uVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0010f352;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_70);
LAB_0010f352:
  local_c0 = &local_b0;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_b0 = *plVar7;
    uStack_a8 = puVar8[3];
  }
  else {
    local_b0 = *plVar7;
    local_c0 = (long *)*puVar8;
  }
  local_b8 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_e0 = *plVar11;
    lStack_d8 = plVar7[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar11;
    local_f0 = (long *)*plVar7;
  }
  local_e8 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar13,(ulong)local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  uVar9 = (ulong)((long)(local_d0->super_SubgraphNode<dg::pta::PSNode>).operands.
                        super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_d0->super_SubgraphNode<dg::pta::PSNode>).operands.
                       super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar6 = (int)uVar9;
  if (iVar6 != 0) {
    local_78 = (ulong)(iVar6 - 1);
    local_80 = uVar9 & 0xffffffff;
    uVar9 = 0;
    do {
      pPVar1 = (local_d0->super_SubgraphNode<dg::pta::PSNode>).operands.
               super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      uVar5 = (pPVar1->super_SubgraphNode<dg::pta::PSNode>).id;
      cVar4 = '\x01';
      if (9 < uVar5) {
        uVar12 = uVar5;
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar12 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_0010f51b;
          }
          if (uVar12 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_0010f51b;
          }
          if (uVar12 < 10000) goto LAB_0010f51b;
          bVar2 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar2);
        cVar4 = cVar4 + '\x01';
      }
LAB_0010f51b:
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct((ulong)&local_f0,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0,(uint)local_e8,uVar5);
      puVar10 = (ulong *)std::__cxx11::string::append((char *)&local_f0);
      psVar13 = local_c8;
      std::__cxx11::string::_M_append((char *)local_c8,*puVar10);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      uVar5 = pPVar1->type - ALLOC;
      pcVar14 = "Unknown type";
      if (uVar5 < 0x17) {
        pcVar14 = (&PTR_anon_var_dwarf_4fcef_00115c08)[uVar5];
      }
      std::__cxx11::string::string((string *)&local_f0,pcVar14,(allocator *)&local_c0);
      std::__cxx11::string::_M_append((char *)psVar13,(ulong)local_f0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (uVar9 != local_78) {
        std::__cxx11::string::append((char *)psVar13);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_80);
  }
  std::__cxx11::string::append((char *)psVar13);
  return;
}

Assistant:

static void dumpNode(const PSNode *nd, std::string &errors) {
    errors += std::string(PSNodeTypeToCString(nd->getType())) + " with ID " +
              std::to_string(nd->getID()) + "\n  - operands: [";
    for (unsigned i = 0, e = nd->getOperandsNum(); i < e; ++i) {
        const PSNode *op = nd->getOperand(i);
        errors += std::to_string(op->getID()) += " ";
        errors += std::string(PSNodeTypeToCString(op->getType()));
        if (i != e - 1)
            errors += ", ";
    }
    errors += "]\n";
}